

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client-mqtt.c
# Opt level: O1

int lws_create_client_mqtt_object(lws_client_connect_info *i,lws *wsi)

{
  lws_mqtt_str_t **ps;
  lws_mqtt_client_connect_param_t *plVar1;
  lws_context *context;
  byte bVar2;
  _lws_mqtt_related *p_Var3;
  size_t sVar4;
  lws_mqtt_str_t *plVar5;
  uint8_t *puVar6;
  size_t sVar7;
  ulong uVar8;
  char *pcVar9;
  ushort local_68 [28];
  
  plVar1 = i->mqtt_cp;
  p_Var3 = (_lws_mqtt_related *)lws_zalloc(0x100,"client mqtt struct");
  wsi->mqtt = p_Var3;
  if (p_Var3 == (_lws_mqtt_related *)0x0) {
LAB_0011aab2:
    pcVar9 = "%s: OOM!\n";
  }
  else {
    p_Var3->wsi = wsi;
    pcVar9 = plVar1->client_id;
    context = wsi->context;
    if (pcVar9 == (char *)0x0) {
      sVar4 = 0x17;
    }
    else {
      sVar4 = strlen(pcVar9);
    }
    if (sVar4 < 0x18) {
      ps = &(p_Var3->client).id;
      plVar5 = lws_mqtt_str_create((uint16_t)(sVar4 + 1));
      *ps = plVar5;
      if (plVar5 != (lws_mqtt_str_t *)0x0) {
        puVar6 = lws_mqtt_str_next(plVar5,(uint16_t *)0x0);
        if (pcVar9 == (char *)0x0) {
          _lws_log(4,"%s: generating random client id\n","lws_mqtt_generate_id");
          sVar7 = lws_get_random(context,local_68,sVar4 * 2);
          if (sVar7 != sVar4 * 2) {
            lws_mqtt_str_free(ps);
            goto LAB_0011aa7a;
          }
          if (sVar4 != 0) {
            uVar8 = 0;
            do {
              puVar6[uVar8] =
                   "0123456789abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"
                   [((local_68[uVar8] >> 1) / 0x1f) * -0x3e + (uint)local_68[uVar8] & 0xffff];
              uVar8 = uVar8 + 1;
            } while (sVar4 != uVar8);
          }
          puVar6[sVar4] = '\0';
        }
        else {
          lws_strncpy((char *)puVar6,pcVar9,sVar4 + 1);
          _lws_log(4,"%s: User space provided a client ID \'%s\'\n","lws_mqtt_generate_id",puVar6);
        }
        lws_mqtt_str_advance(*ps,(int)sVar4);
        _lws_log(8,"%s: using client id \'%.*s\'\n","lws_create_client_mqtt_object",
                 (ulong)(*ps)->len,(*ps)->buf);
        if ((plVar1->clean_start != '\0') || (*plVar1->client_id == '\0')) {
          (p_Var3->client).conn_flags = '\x02';
        }
        (p_Var3->client).keep_alive_secs = plVar1->keep_alive;
        pcVar9 = (plVar1->will_param).topic;
        if ((pcVar9 == (char *)0x0) || (*pcVar9 == '\0')) {
LAB_0011aa16:
          pcVar9 = plVar1->username;
          if (pcVar9 == (char *)0x0) {
            return 0;
          }
          if (*pcVar9 == '\0') {
            return 0;
          }
          plVar5 = lws_mqtt_str_create_cstr_dup(pcVar9,0);
          (p_Var3->client).username = plVar5;
          if (plVar5 != (lws_mqtt_str_t *)0x0) {
            puVar6 = &(p_Var3->client).conn_flags;
            *puVar6 = *puVar6 | 0x80;
            if (plVar1->password == (char *)0x0) {
              return 0;
            }
            plVar5 = lws_mqtt_str_create_cstr_dup(plVar1->password,0);
            (p_Var3->client).password = plVar5;
            if (plVar5 != (lws_mqtt_str_t *)0x0) {
              puVar6 = &(p_Var3->client).conn_flags;
              *puVar6 = *puVar6 | 0x40;
              return 0;
            }
            lws_mqtt_str_free(&(p_Var3->client).username);
          }
          lws_mqtt_str_free(&(p_Var3->client).will.message);
LAB_0011aa9b:
          lws_mqtt_str_free(&(p_Var3->client).will.topic);
        }
        else {
          plVar5 = lws_mqtt_str_create_cstr_dup(pcVar9,0);
          (p_Var3->client).will.topic = plVar5;
          if (plVar5 != (lws_mqtt_str_t *)0x0) {
            puVar6 = &(p_Var3->client).conn_flags;
            *puVar6 = *puVar6 | 4;
            pcVar9 = (plVar1->will_param).message;
            if (pcVar9 == (char *)0x0) {
LAB_0011a9ee:
              bVar2 = ((char)(plVar1->will_param).qos & RESERVED_QOS_LEVEL) << 3 |
                      (p_Var3->client).conn_flags;
              (p_Var3->client).conn_flags = bVar2;
              (p_Var3->client).conn_flags = ((plVar1->will_param).retain != '\0') << 5 | bVar2;
              goto LAB_0011aa16;
            }
            plVar5 = lws_mqtt_str_create_cstr_dup(pcVar9,0);
            (p_Var3->client).will.message = plVar5;
            if (plVar5 != (lws_mqtt_str_t *)0x0) goto LAB_0011a9ee;
            goto LAB_0011aa9b;
          }
        }
        lws_mqtt_str_free(ps);
        goto LAB_0011aab2;
      }
    }
LAB_0011aa7a:
    pcVar9 = "%s: Error generating client ID\n";
  }
  _lws_log(1,pcVar9,"lws_create_client_mqtt_object");
  return 1;
}

Assistant:

int
lws_create_client_mqtt_object(const struct lws_client_connect_info *i,
			      struct lws *wsi)
{
	lws_mqttc_t *c;
	const lws_mqtt_client_connect_param_t *cp = i->mqtt_cp;

	/* allocate the ws struct for the wsi */
	wsi->mqtt = lws_zalloc(sizeof(*wsi->mqtt), "client mqtt struct");
	if (!wsi->mqtt)
		goto oom;

	wsi->mqtt->wsi = wsi;
	c = &wsi->mqtt->client;

	if (lws_mqtt_generate_id(wsi, &c->id, cp->client_id)) {
		lwsl_err("%s: Error generating client ID\n", __func__);
		return 1;
	}
	lwsl_info("%s: using client id '%.*s'\n", __func__, c->id->len,
			(const char *)c->id->buf);

	if (cp->clean_start || !cp->client_id[0])
		c->conn_flags = LMQCFT_CLEAN_START;

	c->keep_alive_secs = cp->keep_alive;

	if (cp->will_param.topic &&
	    *cp->will_param.topic) {
		c->will.topic = lws_mqtt_str_create_cstr_dup(
						cp->will_param.topic, 0);
		if (!c->will.topic)
			goto oom1;
		c->conn_flags |= LMQCFT_WILL_FLAG;
		if (cp->will_param.message) {
			c->will.message = lws_mqtt_str_create_cstr_dup(
						cp->will_param.message, 0);
			if (!c->will.message)
				goto oom2;
		}
		c->conn_flags |= (cp->will_param.qos << 3) & LMQCFT_WILL_QOS_MASK;
		c->conn_flags |= (!!cp->will_param.retain) * LMQCFT_WILL_RETAIN;
	}

	if (cp->username &&
	    *cp->username) {
		c->username = lws_mqtt_str_create_cstr_dup(cp->username, 0);
		if (!c->username)
			goto oom3;
		c->conn_flags |= LMQCFT_USERNAME;
		if (cp->password) {
			c->password =
				lws_mqtt_str_create_cstr_dup(cp->password, 0);
			if (!c->password)
				goto oom4;
			c->conn_flags |= LMQCFT_PASSWORD;
		}
	}

	return 0;
oom4:
	lws_mqtt_str_free(&c->username);
oom3:
	lws_mqtt_str_free(&c->will.message);
oom2:
	lws_mqtt_str_free(&c->will.topic);
oom1:
	lws_mqtt_str_free(&c->id);
oom:
	lwsl_err("%s: OOM!\n", __func__);
	return 1;
}